

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SyntaxNode *args_4;
  StatementSyntax *args_6;
  WaitStatementSyntax *pWVar1;
  DeepCloneVisitor visitor_2;
  NamedLabelSyntax *local_68;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_68 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_68 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x78),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  args_6 = (StatementSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x90),&visitor_2,(BumpAllocator *)__child_stack);
  pWVar1 = BumpAllocator::
           emplace<slang::syntax::WaitStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,&local_68,args_1,(Token *)&visitor,&local_40,
                      (ExpressionSyntax *)args_4,(Token *)&visitor_1,args_6);
  return (int)pWVar1;
}

Assistant:

static SyntaxNode* clone(const WaitStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<WaitStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.wait.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}